

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_portals.cxx
# Opt level: O0

void __thiscall read_portal_v8::operator()(read_portal_v8 *this,portal_data **_portal,xr_reader *r)

{
  uint16_t uVar1;
  uint32_t uVar2;
  portal_data *this_00;
  long local_40;
  uint_fast32_t i;
  portal_data *portal;
  xr_reader *r_local;
  portal_data **_portal_local;
  read_portal_v8 *this_local;
  
  this_00 = (portal_data *)operator_new(0x50);
  xray_re::portal_data::portal_data(this_00);
  *_portal = this_00;
  uVar1 = xray_re::xr_reader::r_u16(r);
  this_00->sector_front = uVar1;
  uVar1 = xray_re::xr_reader::r_u16(r);
  this_00->sector_back = uVar1;
  for (local_40 = 0; local_40 != 6; local_40 = local_40 + 1) {
    xray_re::xr_reader::r_fvector3(r,(this_00->vertices).array + local_40);
  }
  uVar2 = xray_re::xr_reader::r_u32(r);
  (this_00->vertices).count = uVar2;
  return;
}

Assistant:

void operator()(portal_data*& _portal, xr_reader& r) const {
	portal_data* portal = new portal_data;
	_portal = portal;
	portal->sector_front = r.r_u16();
	portal->sector_back = r.r_u16();
	for (uint_fast32_t i = 0; i != 6; ++i)
		r.r_fvector3(portal->vertices.array[i]);
	portal->vertices.count = r.r_u32();
}